

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Vec_Ptr_t * Aig_ManPartitionNaive(Aig_Man_t *p,int nPartSize)

{
  bool bVar1;
  Vec_Ptr_t *p_00;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *p_01;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar6 = p->nObjs[3] / nPartSize;
  bVar1 = 0 < p->nObjs[3] % nPartSize;
  uVar5 = iVar6 + (uint)bVar1;
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  uVar4 = 8;
  if (6 < (iVar6 + (uint)bVar1) - 1) {
    uVar4 = uVar5;
  }
  p_00->nCap = uVar4;
  uVar8 = 0;
  if (uVar4 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)(int)uVar4 << 3);
  }
  p_00->pArray = ppvVar2;
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    pVVar3 = Vec_PtrAlloc(0);
    ppvVar2[uVar8] = pVVar3;
  }
  p_00->nSize = uVar5;
  for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
    Vec_PtrEntry(p->vCos,iVar6);
    p_01 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar6 / nPartSize);
    Vec_IntPush(p_01,iVar6);
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionNaive( Aig_Man_t * p, int nPartSize )
{
    Vec_Ptr_t * vParts;
    Aig_Obj_t * pObj;
    int nParts, i;
    nParts = (Aig_ManCoNum(p) / nPartSize) + ((Aig_ManCoNum(p) % nPartSize) > 0);
    vParts = (Vec_Ptr_t *)Vec_VecStart( nParts );
    Aig_ManForEachCo( p, pObj, i )
        Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(vParts, i / nPartSize), i );
    return vParts;
}